

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_for_each.cpp
# Opt level: O0

void range_based_for_each_index<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(uint w)

{
  code *pcVar1;
  StaticPartitioner<tf::DefaultClosureWrapper> part;
  byte extraout_AL;
  byte extraout_AL_00;
  void *__stat_loc;
  double __x;
  double __x_00;
  Expression_lhs<const_unsigned_long> EVar2;
  Expression_lhs<const_unsigned_long_&> EVar3;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  IndexRange<int> range;
  size_t c;
  size_t n;
  int s;
  int end;
  int beg;
  atomic<unsigned_long> counter;
  Taskflow taskflow;
  Executor executor;
  nullptr_t in_stack_fffffffffffffb78;
  Result *pRVar4;
  undefined4 in_stack_fffffffffffffb80;
  Enum in_stack_fffffffffffffb84;
  Executor *in_stack_fffffffffffffb88;
  int line;
  undefined4 in_stack_fffffffffffffb90;
  Enum in_stack_fffffffffffffb94;
  unsigned_long in_stack_fffffffffffffb98;
  Enum at;
  Taskflow *in_stack_fffffffffffffba0;
  Executor *this;
  ExpressionDecomposer local_434;
  Executor *local_430;
  Enum local_428;
  FlowBuilder *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  TestCaseData *in_stack_fffffffffffffc00;
  anon_class_8_1_bc7188dc in_stack_fffffffffffffc08;
  IndexRange<int> in_stack_fffffffffffffc24;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc70;
  Executor *in_stack_fffffffffffffc78;
  ExpressionDecomposer local_30c;
  unsigned_long local_308;
  Enum local_300;
  ResultBuilder local_2d8;
  IndexRange<int> local_25c;
  ulong local_250;
  enable_if_t<std::is_integral_v<std::decay_t<int>_>_&&_std::is_integral_v<std::decay_t<int>_>_&&_std::is_integral_v<std::decay_t<int>_>,_size_t>
  local_248;
  int local_23c;
  int local_238;
  int local_234;
  undefined1 local_230 [224];
  Executor local_150;
  
  this = &local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),in_stack_fffffffffffffb78
            );
  tf::Executor::Executor
            (in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1b8006);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffba0);
  memset(local_230,0,8);
  local_234 = 10;
  do {
    if (local_234 < -10) {
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      tf::Executor::~Executor(this);
      return;
    }
    for (local_238 = local_234; -0xb < local_238; local_238 = local_238 + -1) {
      for (local_23c = 1; local_23c <= local_234 - local_238; local_23c = local_23c + 1) {
        local_248 = tf::distance<int,int,int>(local_234,local_238,-local_23c);
        for (local_250 = 0; at = (Enum)(in_stack_fffffffffffffb98 >> 0x20), local_250 < 10;
            local_250 = local_250 + 1) {
          tf::Taskflow::clear((Taskflow *)0x1b80d2);
          std::__atomic_base<unsigned_long>::operator=
                    ((__atomic_base<unsigned_long> *)
                     CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                     (__int_type_conflict1)in_stack_fffffffffffffb88);
          tf::IndexRange<int>::IndexRange(&local_25c,local_234,local_238,-local_23c);
          pRVar4 = (Result *)0x1ec1b1;
          doctest::detail::ResultBuilder::ResultBuilder
                    ((ResultBuilder *)in_stack_fffffffffffffba0,at,
                     (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                     (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),"",
                     (char *)this);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_30c,DT_REQUIRE);
          in_stack_fffffffffffffba0 =
               (Taskflow *)tf::IndexRange<int>::size((IndexRange<int> *)0x1b8160);
          EVar2 = doctest::detail::ExpressionDecomposer::operator<<
                            ((ExpressionDecomposer *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (unsigned_long *)pRVar4);
          in_stack_fffffffffffffb98 = EVar2.lhs;
          in_stack_fffffffffffffb94 = EVar2.m_at;
          local_308 = in_stack_fffffffffffffb98;
          local_300 = in_stack_fffffffffffffb94;
          doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
                    ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffffc08.counter,
                     (unsigned_long *)in_stack_fffffffffffffc00);
          doctest::detail::ResultBuilder::setResult
                    ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     pRVar4);
          doctest::detail::Result::~Result((Result *)0x1b820d);
          doctest::detail::ResultBuilder::log(&local_2d8,__x);
          in_stack_fffffffffffffb90 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffb90);
          if ((extraout_AL & 1) != 0) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::ResultBuilder::react
                    ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
          ;
          doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1b833b);
          tf::StaticPartitioner<tf::DefaultClosureWrapper>::StaticPartitioner
                    ((StaticPartitioner<tf::DefaultClosureWrapper> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),(size_t)pRVar4);
          part.super_PartitionerBase<tf::DefaultClosureWrapper>._8_8_ = in_stack_fffffffffffffc00;
          part.super_PartitionerBase<tf::DefaultClosureWrapper>._chunk_size =
               in_stack_fffffffffffffbf8;
          tf::FlowBuilder::
          for_each_by_index<tf::IndexRange<int>,range_based_for_each_index<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<int>)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>
                    (in_stack_fffffffffffffbf0,in_stack_fffffffffffffc24,in_stack_fffffffffffffc08,
                     part);
          __stat_loc = (void *)((long)&local_150._taskflows_mutex.super___mutex_base._M_mutex + 0x10
                               );
          tf::Executor::run(in_stack_fffffffffffffb88,
                            (Taskflow *)
                            CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          line = (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
          std::__basic_future<void>::wait
                    ((__basic_future<void> *)&stack0xfffffffffffffc78,__stat_loc);
          tf::Future<void>::~Future
                    ((Future<void> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          pRVar4 = (Result *)0x1ec1b1;
          doctest::detail::ResultBuilder::ResultBuilder
                    ((ResultBuilder *)in_stack_fffffffffffffba0,
                     (Enum)(in_stack_fffffffffffffb98 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),line,
                     (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),"",
                     (char *)this);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_434,DT_REQUIRE);
          EVar3 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                            ((ExpressionDecomposer *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (unsigned_long *)pRVar4);
          in_stack_fffffffffffffb88 = (Executor *)EVar3.lhs;
          in_stack_fffffffffffffb84 = EVar3.m_at;
          local_430 = in_stack_fffffffffffffb88;
          local_428 = in_stack_fffffffffffffb84;
          doctest::detail::Expression_lhs<const_unsigned_long_&>::
          operator==<std::atomic<unsigned_long>,_nullptr>
                    ((Expression_lhs<const_unsigned_long_&> *)in_stack_fffffffffffffc08.counter,
                     (atomic<unsigned_long> *)in_stack_fffffffffffffc00);
          doctest::detail::ResultBuilder::setResult
                    ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     pRVar4);
          doctest::detail::Result::~Result((Result *)0x1b84ce);
          doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffc00,__x_00);
          in_stack_fffffffffffffb80 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffffb80);
          if ((extraout_AL_00 & 1) != 0) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::ResultBuilder::react
                    ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
          ;
          doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1b85d3);
        }
      }
    }
    local_234 = local_234 + -1;
  } while( true );
}

Assistant:

void range_based_for_each_index(unsigned w) {    
  tf::Executor executor(w);
  tf::Taskflow taskflow;
  std::atomic<size_t> counter {0};

  for(int beg=10; beg>=-10; --beg) {
    for(int end=beg; end>=-10; --end) {
      for(int s=1; s<=beg-end; ++s) {

        size_t n = tf::distance(beg, end, -s);

        for(size_t c=0; c<10; c++) {
          taskflow.clear();
          counter = 0;

          tf::IndexRange range(beg, end, -s);
          REQUIRE(range.size() == n);

          taskflow.for_each_by_index(range, [&] (tf::IndexRange<int> lrange) {
            size_t l = 0;
            for(auto j=lrange.begin(); j>lrange.end(); j+=lrange.step_size()) {
              l++;
            }
            REQUIRE(lrange.size() == l);
            counter.fetch_add(l, std::memory_order_relaxed);
          }, P(c));
          executor.run(taskflow).wait();
          REQUIRE(n == counter);
        }
      }
    }
  }
}